

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_exception.cpp
# Opt level: O0

wstring * __thiscall
PDA::Exception::SourceException::what_abi_cxx11_
          (wstring *__return_storage_ptr__,SourceException *this)

{
  wstring local_c8;
  wstring local_98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  SourceException *local_18;
  SourceException *this_local;
  
  local_18 = this;
  this_local = (SourceException *)__return_storage_ptr__;
  std::__cxx11::to_wstring(&local_98,this->m_line);
  std::operator+(&local_78,&local_98,L':');
  std::__cxx11::to_wstring(&local_c8,this->m_position);
  std::operator+(&local_58,&local_78,&local_c8);
  std::operator+(&local_38,&local_58,L':');
  std::operator+(__return_storage_ptr__,&local_38,&(this->super_Exception).m_information);
  std::__cxx11::wstring::~wstring((wstring *)&local_38);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_c8);
  std::__cxx11::wstring::~wstring((wstring *)&local_78);
  std::__cxx11::wstring::~wstring((wstring *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::wstring SourceException::what() const
{
    return std::to_wstring(m_line) + L':' + std::to_wstring(m_position) + L':' + m_information;
}